

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transaction.cpp
# Opt level: O2

void __thiscall Transaction::Transaction(Transaction *this,int i,int m_)

{
  _Rb_tree_header *p_Var1;
  int j;
  int iVar2;
  undefined1 local_68 [8];
  _Rb_tree_node_base _Stack_60;
  size_t local_40;
  
  this->status = 's';
  this->m = m_;
  this->id = i;
  (this->t_status_mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->t_status_mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->t_status_mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->t_status_mtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->t_status_mtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  p_Var1 = &(this->writeSet)._M_t._M_impl.super__Rb_tree_header;
  (this->writeSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->writeSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->writeSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->writeSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->writeSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->readSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->readSet)._M_t._M_impl.super__Rb_tree_header;
  (this->readSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->readSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->readSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->readSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->local_write_store).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->local_write_store).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->local_write_store).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->start_time).__d.__r = 0;
  (this->end_time).__d.__r = 0;
  local_68 = (undefined1  [8])0x0;
  _Stack_60._0_8_ = (pointer)0x0;
  _Stack_60._M_parent = (_Base_ptr)0x0;
  local_40 = 0;
  _Stack_60._M_left = &_Stack_60;
  _Stack_60._M_right = &_Stack_60;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
            (&(this->writeSet)._M_t,
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_68);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_68);
  local_68 = (undefined1  [8])0x0;
  _Stack_60._0_8_ = (pointer)0x0;
  _Stack_60._M_parent = (_Base_ptr)0x0;
  local_40 = 0;
  _Stack_60._M_left = &_Stack_60;
  _Stack_60._M_right = &_Stack_60;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
            (&(this->readSet)._M_t,
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_68);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_68);
  local_68 = (undefined1  [8])0x0;
  _Stack_60._0_8_ = (pointer)0x0;
  _Stack_60._M_parent = (_Base_ptr)0x0;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->local_write_store,local_68);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_68);
  for (iVar2 = 0; iVar2 < this->m; iVar2 = iVar2 + 1) {
    local_68._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&this->local_write_store,(int *)local_68);
  }
  return;
}

Assistant:

Transaction::Transaction(int i, int m_): id(i), m(m_), status('s') {
    writeSet = std::set<int>();
    readSet = std::set<int>();

    // initialize
    // Initially stores -1 for each item.
    local_write_store = std::vector<int>();
    for(int j=0; j<m; j++) local_write_store.push_back(-1);

}